

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O2

void grayscale_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                      JDIMENSION output_row,int num_rows)

{
  uint uVar1;
  int iVar2;
  JSAMPROW pJVar3;
  JSAMPLE *pJVar4;
  ulong uVar5;
  
  uVar1 = cinfo->image_width;
  iVar2 = cinfo->input_components;
  while (0 < num_rows) {
    num_rows = num_rows + -1;
    pJVar4 = *input_buf;
    pJVar3 = (*output_buf)[output_row];
    for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      pJVar3[uVar5] = *pJVar4;
      pJVar4 = pJVar4 + iVar2;
    }
    input_buf = input_buf + 1;
    output_row = output_row + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
grayscale_convert (j_compress_ptr cinfo,
		   JSAMPARRAY input_buf, JSAMPIMAGE output_buf,
		   JDIMENSION output_row, int num_rows)
{
  register JSAMPROW inptr;
  register JSAMPROW outptr;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->image_width;
  int instride = cinfo->input_components;

  while (--num_rows >= 0) {
    inptr = *input_buf++;
    outptr = output_buf[0][output_row];
    output_row++;
    for (col = 0; col < num_cols; col++) {
      outptr[col] = inptr[0];	/* don't need GETJSAMPLE() here */
      inptr += instride;
    }
  }
}